

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void accumulate_frame_motion_stats
               (FIRSTPASS_STATS *stats,GF_GROUP_STATS *gf_stats,double f_w,double f_h)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined4 in_EAX;
  uint uVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  dVar1 = stats->pcnt_motion;
  dVar8 = stats->mv_in_out_count * dVar1;
  gf_stats->this_frame_mv_in_out = dVar8;
  gf_stats->mv_in_out_accumulator = dVar8 + gf_stats->mv_in_out_accumulator;
  gf_stats->abs_mv_in_out_accumulator = ABS(dVar8) + gf_stats->abs_mv_in_out_accumulator;
  if (0.05 < dVar1) {
    dVar4 = f_w * stats->mvc_abs;
    dVar5 = f_h * stats->mvr_abs;
    auVar6._0_8_ = ABS(stats->mvc_abs);
    auVar6._8_8_ = ABS(stats->mvr_abs);
    auVar7._8_8_ = ABS(stats->MVr) + 1e-06;
    auVar7._0_8_ = ABS(stats->MVc) + 1e-06;
    auVar7 = divpd(auVar6,auVar7);
    dVar8 = auVar7._8_8_;
    auVar2._8_8_ = -(ulong)(dVar8 < dVar5);
    auVar2._0_8_ = -(ulong)(auVar7._0_8_ < dVar4);
    uVar3 = movmskpd(in_EAX,auVar2);
    if ((uVar3 & 2) == 0) {
      dVar8 = dVar5;
    }
    dVar5 = auVar7._0_8_;
    if ((uVar3 & 1) == 0) {
      dVar5 = dVar4;
    }
    gf_stats->mv_ratio_accumulator = dVar1 * dVar5 + dVar8 * dVar1 + gf_stats->mv_ratio_accumulator;
  }
  return;
}

Assistant:

static void accumulate_frame_motion_stats(const FIRSTPASS_STATS *stats,
                                          GF_GROUP_STATS *gf_stats, double f_w,
                                          double f_h) {
  const double pct = stats->pcnt_motion;

  // Accumulate Motion In/Out of frame stats.
  gf_stats->this_frame_mv_in_out = stats->mv_in_out_count * pct;
  gf_stats->mv_in_out_accumulator += gf_stats->this_frame_mv_in_out;
  gf_stats->abs_mv_in_out_accumulator += fabs(gf_stats->this_frame_mv_in_out);

  // Accumulate a measure of how uniform (or conversely how random) the motion
  // field is (a ratio of abs(mv) / mv).
  if (pct > 0.05) {
    const double mvr_ratio =
        fabs(stats->mvr_abs) / DOUBLE_DIVIDE_CHECK(fabs(stats->MVr));
    const double mvc_ratio =
        fabs(stats->mvc_abs) / DOUBLE_DIVIDE_CHECK(fabs(stats->MVc));

    gf_stats->mv_ratio_accumulator +=
        pct *
        (mvr_ratio < stats->mvr_abs * f_h ? mvr_ratio : stats->mvr_abs * f_h);
    gf_stats->mv_ratio_accumulator +=
        pct *
        (mvc_ratio < stats->mvc_abs * f_w ? mvc_ratio : stats->mvc_abs * f_w);
  }
}